

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
          (internal *this,null_terminating_iterator<char> it,
          precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
          *handler)

{
  long lVar1;
  internal iVar2;
  type tVar3;
  format_error *this_00;
  long *plVar4;
  internal *piVar5;
  uint arg_id;
  internal *piVar6;
  internal *piVar7;
  basic_string_view<char> name;
  null_terminating_iterator<char> nVar8;
  error_handler local_71;
  precision_checker<fmt::v5::internal::error_handler> local_70;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  plVar4 = (long *)it.end_;
  piVar5 = (internal *)it.ptr_;
  piVar7 = this;
  if (this == piVar5) {
    iVar2 = (internal)0x0;
LAB_00148e2c:
    if ((iVar2 == (internal)0x5f) || ((byte)(((byte)iVar2 & 0xdf) + 0xbf) < 0x1a)) {
      name.size_ = 0;
      piVar6 = this + 1;
      do {
        piVar7 = piVar6;
        if (piVar7 == piVar5) {
          iVar2 = (internal)0x0;
        }
        else {
          iVar2 = *piVar7;
        }
        piVar6 = piVar7 + 1;
        name.size_ = name.size_ + 1;
      } while ((((byte)((char)iVar2 - 0x30U) < 10) || (iVar2 == (internal)0x5f)) ||
              ((byte)(((byte)iVar2 & 0xdf) + 0xbf) < 0x1a));
      if ((long)name.size_ < 0) {
        __assert_fail("(value >= 0) && \"negative value\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/spirit-code[P]ovf/include/fmt/core.h"
                      ,0xde,
                      "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
                     );
      }
      lVar1 = *(long *)*plVar4;
      name.data_ = (char *)this;
      basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
      ::get_arg((format_arg *)&local_68.string,
                (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
                 *)((long *)*plVar4)[1],name);
      local_38 = local_58;
      uStack_30 = uStack_50;
      local_48.long_long_value = local_68.long_long_value;
      local_48.string.size = local_68.string.size;
      local_70.handler_ = &local_71;
      tVar3 = visit<fmt::v5::internal::precision_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                        (&local_70,
                         (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                          *)&local_48.string);
      if ((tVar3 & 0xffffffff80000000) != 0) {
        this_00 = (format_error *)__cxa_allocate_exception(0x10);
        format_error::format_error(this_00,"number is too big");
LAB_00148f98:
        __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *(int *)(lVar1 + 0x10) = (int)tVar3;
      goto LAB_00148edd;
    }
  }
  else {
    iVar2 = *this;
    if ((iVar2 == (internal)0x7d) || (iVar2 == (internal)0x3a)) {
      lVar1 = *(long *)*plVar4;
      basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
      ::next_arg((format_arg *)&local_68.string,
                 (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
                  *)((long *)*plVar4)[1]);
      local_38 = local_58;
      uStack_30 = uStack_50;
      local_48.long_long_value = local_68.long_long_value;
      local_48.string.size = local_68.string.size;
      local_70.handler_ = &local_71;
      tVar3 = visit<fmt::v5::internal::precision_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                        (&local_70,
                         (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                          *)&local_48.string);
      if ((tVar3 & 0xffffffff80000000) != 0) {
        this_00 = (format_error *)__cxa_allocate_exception(0x10);
        format_error::format_error(this_00,"number is too big");
        goto LAB_00148f98;
      }
      *(int *)(lVar1 + 0x10) = (int)tVar3;
      goto LAB_00148edd;
    }
    if (9 < (byte)((char)iVar2 - 0x30U)) goto LAB_00148e2c;
    arg_id = 0;
    piVar6 = this + 1;
    do {
      if (0xccccccc < arg_id) {
        piVar7 = piVar6 + -1;
        arg_id = 0x80000000;
        goto LAB_00148f04;
      }
      arg_id = ((uint)(byte)iVar2 + arg_id * 10) - 0x30;
      piVar7 = piVar5;
      if (piVar6 == piVar5) break;
      iVar2 = *piVar6;
      piVar7 = piVar6;
      piVar6 = piVar6 + 1;
    } while ((byte)((char)iVar2 - 0x30U) < 10);
    if ((int)arg_id < 0) {
LAB_00148f04:
      context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
      ::on_error(*(context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                   **)(*plVar4 + 8),"number is too big");
    }
    if ((piVar7 != piVar5) && ((*piVar7 == (internal)0x3a || (*piVar7 == (internal)0x7d)))) {
      specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_dynamic_precision<unsigned_int>
                ((specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *)*plVar4,arg_id);
      goto LAB_00148edd;
    }
  }
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ::on_error(*(context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
               **)(*plVar4 + 8),"invalid format string");
LAB_00148edd:
  nVar8.end_ = (char *)piVar5;
  nVar8.ptr_ = (char *)piVar7;
  return nVar8;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(
            pointer_from(start), to_unsigned(it - start)));
  return it;
}